

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void Map::dfs(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *visitedCountries,Country *country,bool continentTest)

{
  pointer ppCVar1;
  iterator iVar2;
  Country **c;
  pointer ppCVar3;
  string local_50;
  
  Country::getCountryName_abi_cxx11_(&local_50,country);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&visitedCountries->_M_t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((_Rb_tree_header *)iVar2._M_node == &(visitedCountries->_M_t)._M_impl.super__Rb_tree_header) {
    Country::getCountryName_abi_cxx11_(&local_50,country);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)visitedCountries,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar1 = (country->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar3 = (country->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar3 != ppCVar1; ppCVar3 = ppCVar3 + 1) {
      if ((!continentTest) || (*(*ppCVar3)->cyContinent == *country->cyContinent)) {
        dfs(visitedCountries,*ppCVar3,continentTest);
      }
    }
  }
  return;
}

Assistant:

void Map::dfs(std::set<std::string>* visitedCountries,Country* country, bool continentTest){
    if(visitedCountries->find(country->getCountryName()) == visitedCountries->end()){
        visitedCountries->insert(country->getCountryName());
        for(auto& c : *country->getAdjCountries()) {
            if(!continentTest || c->getCountryContinent() == country->getCountryContinent()){
                dfs(visitedCountries,c, continentTest);
            }else{
                continue;
            }
        }
    }
}